

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void BrotliCompressFragmentFastImpl11
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  uint8_t *end;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  size_t local_1ce0;
  size_t local_1cd8;
  ulong local_1cc8;
  size_t local_1cc0;
  uint8_t *cmd_depth_local;
  int *table_local;
  int is_last_local;
  size_t input_size_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  size_t insert_1;
  uint32_t cur_hash_1;
  uint32_t prev_hash_1;
  uint64_t input_bytes_1;
  size_t matched_2;
  uint8_t *base_1;
  uint32_t cur_hash;
  uint32_t prev_hash;
  uint64_t input_bytes;
  size_t insert;
  int distance;
  size_t matched;
  uint8_t *base;
  uint32_t bytes_between_hash_lookups;
  uint32_t hash;
  uint8_t *candidate;
  uint8_t *next_ip;
  uint32_t skip;
  uint32_t next_hash;
  uint8_t *ip_limit;
  size_t len_limit;
  size_t i;
  size_t shift;
  long *plStack_1be8;
  int last_distance;
  uint8_t *ip;
  size_t literal_ratio;
  uint16_t lit_bits [256];
  uint8_t lit_depth [256];
  size_t local_18d0;
  size_t mlen_storage_ix;
  size_t total_block_size;
  size_t block_size;
  uint8_t *metablock_start;
  size_t kMinMatchLen;
  size_t kInputMarginBytes;
  uint8_t *base_ip;
  uint8_t *next_emit;
  uint8_t *ip_end;
  uint32_t cmd_histo [128];
  ulong local_1640;
  uint8_t *local_1638;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_17;
  uint8_t *p_17;
  uint64_t v_54;
  uint8_t *p_54;
  uint64_t v_56;
  uint8_t *p_56;
  uint64_t v_55;
  uint8_t *p_55;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t h_11;
  uint64_t h_2;
  uint64_t h_1;
  uint64_t h;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_3;
  ulong *local_1380;
  size_t local_1370;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched_1;
  ulong *local_1340;
  size_t local_1330;
  size_t code_1;
  uint32_t nbits_1;
  size_t tail_1;
  size_t inscode;
  size_t prefix;
  uint32_t nbits;
  size_t tail;
  size_t code;
  uint64_t v_11;
  uint8_t *p_11;
  uint64_t v_10;
  uint8_t *p_10;
  uint64_t v_9;
  uint8_t *p_9;
  uint64_t v_8;
  uint8_t *p_8;
  uint64_t v_7;
  uint8_t *p_7;
  uint64_t v_6;
  uint8_t *p_6;
  uint64_t v_5;
  uint8_t *p_5;
  size_t code_8;
  uint32_t nbits_9;
  size_t tail_8;
  size_t inscode_1;
  size_t prefix_5;
  uint32_t nbits_8;
  size_t tail_7;
  size_t code_7;
  uint64_t v_47;
  uint8_t *p_47;
  uint64_t v_46;
  uint8_t *p_46;
  uint64_t v_45;
  uint8_t *p_45;
  uint64_t v_44;
  uint8_t *p_44;
  uint64_t v_43;
  uint8_t *p_43;
  uint64_t v_42;
  uint8_t *p_42;
  uint64_t v_41;
  uint8_t *p_41;
  size_t compressed;
  size_t compressed_1;
  uint64_t v_15;
  uint8_t *p_15;
  uint64_t v_14;
  uint8_t *p_14;
  uint64_t v_13;
  uint8_t *p_13;
  uint64_t v_12;
  uint8_t *p_12;
  uint64_t v_52;
  uint8_t *p_52;
  uint64_t v_51;
  uint8_t *p_51;
  uint64_t v_50;
  uint8_t *p_50;
  uint64_t v_49;
  uint8_t *p_49;
  ulong uStack_d40;
  uint8_t lit;
  size_t j;
  uint64_t v_16;
  uint8_t *p_16;
  ulong uStack_cd0;
  uint8_t lit_1;
  size_t j_1;
  uint64_t v_48;
  uint8_t *p_48;
  ulong uStack_c60;
  uint8_t lit_2;
  size_t j_2;
  uint64_t v_53;
  uint8_t *p_53;
  size_t distcode_1;
  size_t offset_1;
  size_t prefix_4;
  uint32_t nbits_7;
  size_t d_1;
  uint64_t v_40;
  uint8_t *p_40;
  uint64_t v_39;
  uint8_t *p_39;
  size_t distcode;
  size_t offset;
  size_t prefix_1;
  uint32_t nbits_2;
  size_t d;
  uint64_t v_19;
  uint8_t *p_19;
  uint64_t v_18;
  uint8_t *p_18;
  size_t code_4;
  uint32_t nbits_4;
  size_t tail_4;
  size_t code_3;
  size_t tail_3;
  size_t code_2;
  size_t prefix_2;
  uint32_t nbits_3;
  size_t tail_2;
  uint64_t v_31;
  uint8_t *p_31;
  uint64_t v_30;
  uint8_t *p_30;
  uint64_t v_29;
  uint8_t *p_29;
  uint64_t v_28;
  uint8_t *p_28;
  uint64_t v_27;
  uint8_t *p_27;
  uint64_t v_26;
  uint8_t *p_26;
  uint64_t v_25;
  uint8_t *p_25;
  uint64_t v_24;
  uint8_t *p_24;
  uint64_t v_23;
  uint8_t *p_23;
  uint64_t v_22;
  uint8_t *p_22;
  uint64_t v_21;
  uint8_t *p_21;
  uint64_t v_20;
  uint8_t *p_20;
  uint64_t t_10;
  uint64_t t_9;
  uint64_t t_8;
  uint64_t t_7;
  uint64_t t_17;
  uint64_t t_16;
  uint64_t t_15;
  uint64_t t_14;
  uint64_t t;
  uint64_t t_1;
  uint64_t t_2;
  uint64_t t_19;
  uint64_t t_18;
  uint64_t t_11;
  uint64_t h_10;
  uint64_t h_9;
  uint64_t h_8;
  uint64_t h_7;
  uint64_t h_6;
  uint64_t h_5;
  uint64_t h_4;
  uint64_t h_3;
  size_t code_6;
  uint32_t nbits_6;
  size_t tail_6;
  size_t code_5;
  size_t prefix_3;
  uint32_t nbits_5;
  size_t tail_5;
  uint64_t v_38;
  uint8_t *p_38;
  uint64_t v_37;
  uint8_t *p_37;
  uint64_t v_36;
  uint8_t *p_36;
  uint64_t v_35;
  uint8_t *p_35;
  uint64_t v_34;
  uint8_t *p_34;
  uint64_t v_33;
  uint8_t *p_33;
  uint64_t v_32;
  uint8_t *p_32;
  uint32_t t_4;
  uint32_t t_3;
  uint32_t t_6;
  uint32_t t_5;
  uint32_t t_13;
  uint32_t t_12;
  
  cmd_histo._504_8_ = storage;
  local_1cc0 = input_size;
  if (0x17fff < input_size) {
    local_1cc0 = 0x18000;
  }
  total_block_size = local_1cc0;
  mlen_storage_ix = local_1cc0;
  local_18d0 = *storage_ix + 3;
  if (input_size == 0) {
    if (is_last != 0) {
      *(ulong *)(storage + (*storage_ix >> 3)) =
           1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 1;
      *(ulong *)(storage + (*storage_ix >> 3)) =
           1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 1;
      *storage_ix = *storage_ix + 7 & 0xfffffff8;
      return;
    }
    __assert_fail("is_last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x1d3,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  BrotliStoreMetaBlockHeader(local_1cc0,0,storage_ix,storage);
  puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
  *puVar7 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
  *storage_ix = *storage_ix + 0xd;
  ip = (uint8_t *)
       BuildAndStoreLiteralPrefixCode
                 (m,input,local_1cc0,(uint8_t *)(lit_bits + 0xfc),(uint16_t *)&literal_ratio,
                  storage_ix,(uint8_t *)cmd_histo._504_8_);
  for (len_limit = 0; len_limit + 7 < *cmd_code_numbits; len_limit = len_limit + 8) {
    puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
    *puVar7 = (ulong)cmd_code[len_limit >> 3] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
    *storage_ix = *storage_ix + 8;
  }
  uVar15 = *cmd_code_numbits & 7;
  puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
  if (cmd_code[*cmd_code_numbits >> 3] >> (sbyte)uVar15 != 0) {
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  if (0x38 < uVar15) {
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                  ,0x37,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  *puVar7 = (ulong)cmd_code[*cmd_code_numbits >> 3] << ((byte)*storage_ix & 7) |
            (ulong)(byte)*puVar7;
  *storage_ix = uVar15 + *storage_ix;
  block_size = (size_t)input;
  base_ip = input;
  local_1640 = input_size;
  local_1638 = input;
  while( true ) {
    memcpy(&ip_end,kCmdHistoSeed,0x200);
    shift._4_4_ = -1;
    end = local_1638 + total_block_size;
    if (0xf < total_block_size) break;
LAB_00154016:
    if (end < base_ip) {
      __assert_fail("next_emit <= ip_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x29f,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    local_1638 = local_1638 + total_block_size;
    local_1640 = local_1640 - total_block_size;
    local_1cd8 = local_1640;
    if (0xffff < local_1640) {
      local_1cd8 = 0x10000;
    }
    total_block_size = local_1cd8;
    if (((local_1640 == 0) || (0x100000 < mlen_storage_ix + local_1cd8)) ||
       (iVar4 = ShouldMergeBlock(local_1638,local_1cd8,(uint8_t *)(lit_bits + 0xfc)), iVar4 == 0)) {
      if (base_ip < end) {
        uVar15 = (long)end - (long)base_ip;
        if (uVar15 < 0x1842) {
          if (uVar15 < 6) {
            bVar1 = cmd_depth[uVar15 + 0x28];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (cmd_bits[uVar15 + 0x28] >> (bVar1 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)bVar1) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = (ulong)cmd_bits[uVar15 + 0x28] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            cmd_histo[uVar15 + 0x26] = cmd_histo[uVar15 + 0x26] + 1;
          }
          else if (uVar15 < 0x82) {
            uVar13 = uVar15 - 2;
            iVar4 = 0x1f;
            if ((uint)uVar13 != 0) {
              for (; (uint)uVar13 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            uVar5 = iVar4 - 1;
            bVar14 = (byte)uVar5;
            uVar11 = uVar13 >> (bVar14 & 0x3f);
            lVar12 = uVar5 * 2 + uVar11;
            bVar1 = cmd_depth[lVar12 + 0x2a];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (cmd_bits[lVar12 + 0x2a] >> (bVar1 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)bVar1) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = (ulong)cmd_bits[lVar12 + 0x2a] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            uVar13 = uVar13 - (uVar11 << (bVar14 & 0x3f));
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (uVar13 >> (bVar14 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)uVar5) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = uVar13 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)uVar5 + *storage_ix;
            cmd_histo[lVar12 + 0x28] = cmd_histo[lVar12 + 0x28] + 1;
          }
          else if (uVar15 < 0x842) {
            uVar5 = 0x1f;
            uVar6 = (uint)(uVar15 - 0x42);
            if (uVar6 != 0) {
              for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar13 = (ulong)(uVar5 + 0x32);
            bVar1 = cmd_depth[uVar13];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (cmd_bits[uVar13] >> (bVar1 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)bVar1) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = (ulong)cmd_bits[uVar13] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            uVar11 = (uVar15 - 0x42) - (1L << ((byte)uVar5 & 0x3f));
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (uVar11 >> ((byte)uVar5 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)uVar5) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = uVar11 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)uVar5 + *storage_ix;
            cmd_histo[uVar13 - 2] = cmd_histo[uVar13 - 2] + 1;
          }
          else {
            bVar1 = cmd_depth[0x3d];
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (cmd_bits[0x3d] >> (bVar1 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)bVar1) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = (ulong)cmd_bits[0x3d] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (uVar15 - 0x842 >> 0xc != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = uVar15 - 0x842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
            *storage_ix = *storage_ix + 0xc;
            cmd_histo[0x13] = cmd_histo[0x13] + 1;
          }
          for (uStack_cd0 = 0; uStack_cd0 < uVar15; uStack_cd0 = uStack_cd0 + 1) {
            bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_cd0] + 0x1f8);
            puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
            if (lit_bits[(ulong)base_ip[uStack_cd0] - 4] >> (bVar1 & 0x3f) != 0) {
              __assert_fail("(bits >> n_bits) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x36,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            if (0x38 < (ulong)bVar1) {
              __assert_fail("n_bits <= 56",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                            ,0x37,
                            "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                           );
            }
            *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_cd0] - 4] << ((byte)*storage_ix & 7) |
                      (ulong)(byte)*puVar7;
            *storage_ix = (ulong)bVar1 + *storage_ix;
          }
        }
        else {
          uVar13 = ((long)base_ip - block_size) * 0x32;
          if ((uVar13 < uVar15 || uVar13 - uVar15 == 0) && (uint8_t *)0x3d4 < ip) {
            EmitUncompressedMetaBlock
                      ((uint8_t *)block_size,end,local_18d0 - 3,storage_ix,
                       (uint8_t *)cmd_histo._504_8_);
          }
          else {
            if (uVar15 < 0x5842) {
              bVar1 = cmd_depth[0x3e];
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              if (cmd_bits[0x3e] >> (bVar1 & 0x3f) != 0) {
                __assert_fail("(bits >> n_bits) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x36,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              if (0x38 < (ulong)bVar1) {
                __assert_fail("n_bits <= 56",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x37,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              *puVar7 = (ulong)cmd_bits[0x3e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              if (uVar15 - 0x1842 >> 0xe != 0) {
                __assert_fail("(bits >> n_bits) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x36,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              *puVar7 = uVar15 - 0x1842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = *storage_ix + 0xe;
              cmd_histo[0x14] = cmd_histo[0x14] + 1;
            }
            else {
              bVar1 = cmd_depth[0x3f];
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              if (cmd_bits[0x3f] >> (bVar1 & 0x3f) != 0) {
                __assert_fail("(bits >> n_bits) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x36,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              if (0x38 < (ulong)bVar1) {
                __assert_fail("n_bits <= 56",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x37,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              *puVar7 = (ulong)cmd_bits[0x3f] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              if (uVar15 - 0x5842 >> 0x18 != 0) {
                __assert_fail("(bits >> n_bits) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x36,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              *puVar7 = uVar15 - 0x5842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
              *storage_ix = *storage_ix + 0x18;
              cmd_histo[0x15] = cmd_histo[0x15] + 1;
            }
            for (uStack_c60 = 0; uStack_c60 < uVar15; uStack_c60 = uStack_c60 + 1) {
              bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_c60] + 0x1f8);
              puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
              if (lit_bits[(ulong)base_ip[uStack_c60] - 4] >> (bVar1 & 0x3f) != 0) {
                __assert_fail("(bits >> n_bits) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x36,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              if (0x38 < (ulong)bVar1) {
                __assert_fail("n_bits <= 56",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                              ,0x37,
                              "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                             );
              }
              *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_c60] - 4] << ((byte)*storage_ix & 7) |
                        (ulong)(byte)*puVar7;
              *storage_ix = (ulong)bVar1 + *storage_ix;
            }
          }
        }
      }
LAB_00155667:
      if (local_1640 == 0) {
        if (is_last != 0) {
          puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
          *puVar7 = 1L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
          *storage_ix = *storage_ix + 1;
          puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
          *puVar7 = 1L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
          *storage_ix = *storage_ix + 1;
          *storage_ix = *storage_ix + 7 & 0xfffffff8;
          return;
        }
        *cmd_code = '\0';
        *cmd_code_numbits = 0;
        BuildAndStoreCommandPrefixCode
                  ((uint32_t *)&ip_end,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
        return;
      }
      block_size = (size_t)local_1638;
      if (local_1640 < 0x18000) {
        local_1ce0 = local_1640;
      }
      else {
        local_1ce0 = 0x18000;
      }
      total_block_size = local_1ce0;
      mlen_storage_ix = local_1ce0;
      local_18d0 = *storage_ix + 3;
      BrotliStoreMetaBlockHeader(local_1ce0,0,storage_ix,(uint8_t *)cmd_histo._504_8_);
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      *puVar7 = 0L << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = *storage_ix + 0xd;
      ip = (uint8_t *)
           BuildAndStoreLiteralPrefixCode
                     (m,local_1638,local_1ce0,(uint8_t *)(lit_bits + 0xfc),
                      (uint16_t *)&literal_ratio,storage_ix,(uint8_t *)cmd_histo._504_8_);
      BuildAndStoreCommandPrefixCode
                ((uint32_t *)&ip_end,cmd_depth,cmd_bits,storage_ix,(uint8_t *)cmd_histo._504_8_);
      base_ip = local_1638;
    }
    else {
      if (mlen_storage_ix < 0x10001) {
        __assert_fail("total_block_size > (1 << 16)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                      ,0x2a9,
                      "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                     );
      }
      mlen_storage_ix = local_1cd8 + mlen_storage_ix;
      UpdateBits(0x14,(int)mlen_storage_ix - 1,local_18d0,(uint8_t *)cmd_histo._504_8_);
    }
  }
  local_1cc8 = local_1640 - 0x10;
  if (total_block_size - 5 < local_1cc8) {
    local_1cc8 = total_block_size - 5;
  }
  plVar8 = (long *)(local_1638 + local_1cc8);
  uVar5 = (uint)((ulong)(*(long *)(local_1638 + 1) * 0x1e35a7bd000000) >> 0x20);
  plVar9 = (long *)(local_1638 + 1);
  do {
    plStack_1be8 = plVar9;
    next_ip._4_4_ = uVar5 >> 0x15;
    next_ip._0_4_ = 0x20;
    candidate = (uint8_t *)plStack_1be8;
    plVar9 = (long *)candidate;
    if (plStack_1be8 <= base_ip) {
      __assert_fail("next_emit < ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x216,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
LAB_0014f674:
    do {
      candidate = (uint8_t *)plVar9;
      uVar5 = (uint)next_ip + 1;
      if (next_ip._4_4_ != (uint)((ulong)(*(long *)candidate * 0x1e35a7bd000000) >> 0x35)) {
        __assert_fail("hash == Hash(next_ip, shift)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                      ,0x21b,
                      "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                     );
      }
      plVar9 = (long *)(candidate + ((uint)next_ip >> 5));
      if (plVar8 < plVar9) goto LAB_00154016;
      uVar6 = (uint)((ulong)(*plVar9 * 0x1e35a7bd000000) >> 0x35);
      _bytes_between_hash_lookups = (int *)(candidate + -(long)shift._4_4_);
      bVar16 = false;
      if (*(int *)candidate == *_bytes_between_hash_lookups) {
        bVar16 = candidate[4] == (uint8_t)_bytes_between_hash_lookups[1];
      }
      iVar4 = (int)candidate;
      iVar2 = (int)input;
      next_ip._0_4_ = uVar5;
      if ((bVar16) && (_bytes_between_hash_lookups < candidate)) {
        table[next_ip._4_4_] = iVar4 - iVar2;
      }
      else {
        _bytes_between_hash_lookups = (int *)(input + table[next_ip._4_4_]);
        if (_bytes_between_hash_lookups < input) {
          __assert_fail("candidate >= base_ip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                        ,0x22a,
                        "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                       );
        }
        if (candidate <= _bytes_between_hash_lookups) {
          __assert_fail("candidate < ip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                        ,0x22b,
                        "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                       );
        }
        table[next_ip._4_4_] = iVar4 - iVar2;
        bVar16 = false;
        if (*(int *)candidate == *_bytes_between_hash_lookups) {
          bVar16 = candidate[4] == (uint8_t)_bytes_between_hash_lookups[1];
        }
        next_ip._4_4_ = uVar6;
        if (!bVar16) goto LAB_0014f674;
      }
      next_ip._4_4_ = uVar6;
    } while (0x3fff0 < (long)candidate - (long)_bytes_between_hash_lookups);
    local_1340 = (ulong *)(candidate + 5);
    limit2 = 0;
    x = ((ulong)(end + (-5 - (long)candidate)) >> 3) + 1;
LAB_0014fa91:
    x = x - 1;
    if (x != 0) {
      if (*local_1340 == *(ulong *)((long)_bytes_between_hash_lookups + limit2 + 5)) break;
      iVar3 = 0;
      for (uVar15 = *local_1340 ^ *(ulong *)((long)_bytes_between_hash_lookups + limit2 + 5);
          (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        iVar3 = iVar3 + 1;
      }
      local_1330 = ((ulong)(long)iVar3 >> 3) + limit2;
      goto LAB_0014fc6c;
    }
    matched_1 = ((ulong)(end + (-5 - (long)candidate)) & 7) + 1;
    while (matched_1 = matched_1 - 1, matched_1 != 0) {
      if (*(char *)((long)_bytes_between_hash_lookups + limit2 + 5) != (char)*local_1340) {
        local_1330 = limit2;
        goto LAB_0014fc6c;
      }
      local_1340 = (ulong *)((long)local_1340 + 1);
      limit2 = limit2 + 1;
    }
    local_1330 = limit2;
LAB_0014fc6c:
    uVar15 = local_1330 + 5;
    iVar4 = iVar4 - (int)_bytes_between_hash_lookups;
    uVar13 = (long)candidate - (long)base_ip;
    plStack_1be8 = (long *)(candidate + uVar15);
    iVar3 = memcmp(candidate,_bytes_between_hash_lookups,uVar15);
    if (iVar3 != 0) {
      __assert_fail("0 == memcmp(base, candidate, matched)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x242,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    if (uVar13 < 0x1842) {
      if (uVar13 < 6) {
        bVar1 = cmd_depth[uVar13 + 0x28];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[uVar13 + 0x28] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[uVar13 + 0x28] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar13 + 0x26] = cmd_histo[uVar13 + 0x26] + 1;
      }
      else if (uVar13 < 0x82) {
        uVar11 = uVar13 - 2;
        iVar3 = 0x1f;
        if ((uint)uVar11 != 0) {
          for (; (uint)uVar11 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar5 = iVar3 - 1;
        bVar14 = (byte)uVar5;
        uVar10 = uVar11 >> (bVar14 & 0x3f);
        lVar12 = uVar5 * 2 + uVar10;
        bVar1 = cmd_depth[lVar12 + 0x2a];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[lVar12 + 0x2a] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[lVar12 + 0x2a] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        uVar11 = uVar11 - (uVar10 << (bVar14 & 0x3f));
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar11 >> (bVar14 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar5) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar11 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[lVar12 + 0x28] = cmd_histo[lVar12 + 0x28] + 1;
      }
      else if (uVar13 < 0x842) {
        uVar5 = 0x1f;
        uVar6 = (uint)(uVar13 - 0x42);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar11 = (ulong)(uVar5 + 0x32);
        bVar1 = cmd_depth[uVar11];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[uVar11] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[uVar11] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        uVar10 = (uVar13 - 0x42) - (1L << ((byte)uVar5 & 0x3f));
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar10 >> ((byte)uVar5 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar5) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar10 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[uVar11 - 2] = cmd_histo[uVar11 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x3d];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x3d] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x3d] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar13 - 0x842 >> 0xc != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar13 - 0x842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0xc;
        cmd_histo[0x13] = cmd_histo[0x13] + 1;
      }
    }
    else {
      uVar11 = ((long)base_ip - block_size) * 0x32;
      if ((uVar11 < uVar13 || uVar11 - uVar13 == 0) && (uint8_t *)0x3d4 < ip) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)block_size,candidate,local_18d0 - 3,storage_ix,
                   (uint8_t *)cmd_histo._504_8_);
        local_1640 = local_1640 - ((long)candidate - (long)local_1638);
        local_1638 = candidate;
        goto LAB_00155667;
      }
      if (uVar13 < 0x5842) {
        bVar1 = cmd_depth[0x3e];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x3e] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x3e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar13 - 0x1842 >> 0xe != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar13 - 0x1842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0xe;
        cmd_histo[0x14] = cmd_histo[0x14] + 1;
      }
      else {
        bVar1 = cmd_depth[0x3f];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x3f] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x3f] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar13 - 0x5842 >> 0x18 != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar13 - 0x5842 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        cmd_histo[0x15] = cmd_histo[0x15] + 1;
      }
    }
    for (uStack_d40 = 0; uStack_d40 < uVar13; uStack_d40 = uStack_d40 + 1) {
      bVar1 = *(byte *)((long)lit_bits + (ulong)base_ip[uStack_d40] + 0x1f8);
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (lit_bits[(ulong)base_ip[uStack_d40] - 4] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)lit_bits[(ulong)base_ip[uStack_d40] - 4] << ((byte)*storage_ix & 7) |
                (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
    }
    if (iVar4 == shift._4_4_) {
      bVar1 = cmd_depth[0x40];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
    }
    else {
      uVar13 = (long)iVar4 + 3;
      iVar3 = 0x1f;
      if ((uint)uVar13 != 0) {
        for (; (uint)uVar13 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = iVar3 - 1;
      bVar14 = (byte)uVar5;
      uVar11 = uVar13 >> (bVar14 & 0x3f) & 1;
      lVar12 = (uint)((iVar3 + -2) * 2) + uVar11;
      bVar1 = cmd_depth[lVar12 + 0x50];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (cmd_bits[lVar12 + 0x50] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)cmd_bits[lVar12 + 0x50] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      uVar13 = uVar13 - (uVar11 + 2 << (bVar14 & 0x3f));
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (uVar13 >> (bVar14 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)uVar5) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = uVar13 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)uVar5 + *storage_ix;
      cmd_histo[lVar12 + 0x4e] = cmd_histo[lVar12 + 0x4e] + 1;
      shift._4_4_ = iVar4;
    }
    if (uVar15 < 0xc) {
      bVar1 = cmd_depth[local_1330 + 1];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (cmd_bits[local_1330 + 1] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)cmd_bits[local_1330 + 1] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      cmd_histo[local_1330 - 1] = cmd_histo[local_1330 - 1] + 1;
    }
    else if (uVar15 < 0x48) {
      uVar15 = local_1330 - 3;
      iVar4 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar5 = iVar4 - 1;
      bVar14 = (byte)uVar5;
      uVar13 = uVar15 >> (bVar14 & 0x3f);
      lVar12 = uVar5 * 2 + uVar13;
      bVar1 = cmd_depth[lVar12 + 4];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (cmd_bits[lVar12 + 4] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)cmd_bits[lVar12 + 4] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      uVar15 = uVar15 - (uVar13 << (bVar14 & 0x3f));
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (uVar15 >> (bVar14 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)uVar5) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = uVar15 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)uVar5 + *storage_ix;
      cmd_histo[lVar12 + 2] = cmd_histo[lVar12 + 2] + 1;
    }
    else {
      if (uVar15 < 0x88) {
        uVar15 = local_1330 - 3 >> 5;
        bVar1 = cmd_depth[uVar15 + 0x1e];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[uVar15 + 0x1e] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[uVar15 + 0x1e] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        *puVar7 = (local_1330 - 3 & 0x1f) << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 5;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar15 + 0x1c] = cmd_histo[uVar15 + 0x1c] + 1;
      }
      else if (uVar15 < 0x848) {
        uVar5 = 0x1f;
        uVar6 = (uint)(local_1330 - 0x43);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar15 = (ulong)(uVar5 + 0x1c);
        bVar1 = cmd_depth[uVar15];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[uVar15] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[uVar15] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        uVar13 = (local_1330 - 0x43) - (1L << ((byte)uVar5 & 0x3f));
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar13 >> ((byte)uVar5 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar5) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar13 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[uVar15 - 2] = cmd_histo[uVar15 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x27];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x27] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x27] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (local_1330 - 0x843 >> 0x18 != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = local_1330 - 0x843 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        bVar1 = cmd_depth[0x40];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x40] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x40] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[0x2d] = cmd_histo[0x2d] + 1;
      }
      cmd_histo[0x3e] = cmd_histo[0x3e] + 1;
    }
    base_ip = (uint8_t *)plStack_1be8;
    if (plVar8 <= plStack_1be8) goto LAB_00154016;
    uVar15 = *(ulong *)((long)plStack_1be8 + -3);
    uVar13 = (uVar15 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
    iVar3 = (int)plStack_1be8;
    table[uVar15 * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -3;
    table[(uVar15 >> 8) * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -2;
    table[(uVar15 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -1;
    iVar4 = table[uVar13];
    table[uVar13] = iVar3 - iVar2;
    while( true ) {
      _bytes_between_hash_lookups = (int *)(input + iVar4);
      bVar16 = false;
      if ((int)*plStack_1be8 == *_bytes_between_hash_lookups) {
        bVar16 = *(char *)((long)plStack_1be8 + 4) == (char)_bytes_between_hash_lookups[1];
      }
      if (!bVar16) break;
      local_1380 = (ulong *)((long)plStack_1be8 + 5);
      limit2_1 = 0;
      x_1 = ((ulong)(end + (-5 - (long)plStack_1be8)) >> 3) + 1;
LAB_00152b30:
      x_1 = x_1 - 1;
      if (x_1 != 0) {
        if (*local_1380 == *(ulong *)((long)_bytes_between_hash_lookups + limit2_1 + 5))
        goto LAB_00152bae;
        iVar4 = 0;
        for (uVar15 = *local_1380 ^ *(ulong *)((long)_bytes_between_hash_lookups + limit2_1 + 5);
            (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar4 = iVar4 + 1;
        }
        local_1370 = ((ulong)(long)iVar4 >> 3) + limit2_1;
        goto LAB_00152d0b;
      }
      matched_3 = ((ulong)(end + (-5 - (long)plStack_1be8)) & 7) + 1;
      while (matched_3 = matched_3 - 1, matched_3 != 0) {
        if (*(char *)((long)_bytes_between_hash_lookups + limit2_1 + 5) != (char)*local_1380) {
          local_1370 = limit2_1;
          goto LAB_00152d0b;
        }
        local_1380 = (ulong *)((long)local_1380 + 1);
        limit2_1 = limit2_1 + 1;
      }
      local_1370 = limit2_1;
LAB_00152d0b:
      uVar15 = local_1370 + 5;
      if (0x3fff0 < (long)plStack_1be8 - (long)_bytes_between_hash_lookups) break;
      base_ip = (uint8_t *)(uVar15 + (long)plStack_1be8);
      shift._4_4_ = (int)plStack_1be8 - (int)_bytes_between_hash_lookups;
      iVar4 = memcmp(plStack_1be8,_bytes_between_hash_lookups,uVar15);
      if (iVar4 != 0) {
        __assert_fail("0 == memcmp(base, candidate, matched)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                      ,0x27e,
                      "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                     );
      }
      if (uVar15 < 10) {
        bVar1 = cmd_depth[local_1370 + 0x13];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[local_1370 + 0x13] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[local_1370 + 0x13] << ((byte)*storage_ix & 7) |
                  (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        cmd_histo[local_1370 + 0x11] = cmd_histo[local_1370 + 0x11] + 1;
      }
      else if (uVar15 < 0x86) {
        uVar15 = local_1370 - 1;
        iVar4 = 0x1f;
        if ((uint)uVar15 != 0) {
          for (; (uint)uVar15 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar5 = iVar4 - 1;
        bVar14 = (byte)uVar5;
        uVar13 = uVar15 >> (bVar14 & 0x3f);
        lVar12 = uVar5 * 2 + uVar13;
        bVar1 = cmd_depth[lVar12 + 0x14];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[lVar12 + 0x14] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[lVar12 + 0x14] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        uVar15 = uVar15 - (uVar13 << (bVar14 & 0x3f));
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar15 >> (bVar14 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar5) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar15 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[lVar12 + 0x12] = cmd_histo[lVar12 + 0x12] + 1;
      }
      else if (uVar15 < 0x846) {
        uVar5 = 0x1f;
        uVar6 = (uint)(local_1370 - 0x41);
        if (uVar6 != 0) {
          for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar15 = (ulong)(uVar5 + 0x1c);
        bVar1 = cmd_depth[uVar15];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[uVar15] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[uVar15] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        uVar13 = (local_1370 - 0x41) - (1L << ((byte)uVar5 & 0x3f));
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (uVar13 >> ((byte)uVar5 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)uVar5) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = uVar13 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)uVar5 + *storage_ix;
        cmd_histo[uVar15 - 2] = cmd_histo[uVar15 - 2] + 1;
      }
      else {
        bVar1 = cmd_depth[0x27];
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (cmd_bits[0x27] >> (bVar1 & 0x3f) != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < (ulong)bVar1) {
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = (ulong)cmd_bits[0x27] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = (ulong)bVar1 + *storage_ix;
        puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
        if (local_1370 - 0x841 >> 0x18 != 0) {
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        *puVar7 = local_1370 - 0x841 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
        *storage_ix = *storage_ix + 0x18;
        cmd_histo[0x2d] = cmd_histo[0x2d] + 1;
      }
      uVar15 = (long)shift._4_4_ + 3;
      iVar4 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar5 = iVar4 - 1;
      bVar14 = (byte)uVar5;
      uVar13 = uVar15 >> (bVar14 & 0x3f) & 1;
      lVar12 = (uint)((iVar4 + -2) * 2) + uVar13;
      bVar1 = cmd_depth[lVar12 + 0x50];
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (cmd_bits[lVar12 + 0x50] >> (bVar1 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)bVar1) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = (ulong)cmd_bits[lVar12 + 0x50] << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)bVar1 + *storage_ix;
      uVar15 = uVar15 - (uVar13 + 2 << (bVar14 & 0x3f));
      puVar7 = (ulong *)(cmd_histo._504_8_ + (*storage_ix >> 3));
      if (uVar15 >> (bVar14 & 0x3f) != 0) {
        __assert_fail("(bits >> n_bits) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x36,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < (ulong)uVar5) {
        __assert_fail("n_bits <= 56",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                      ,0x37,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      *puVar7 = uVar15 << ((byte)*storage_ix & 7) | (ulong)(byte)*puVar7;
      *storage_ix = (ulong)uVar5 + *storage_ix;
      cmd_histo[lVar12 + 0x4e] = cmd_histo[lVar12 + 0x4e] + 1;
      if (plVar8 <= base_ip) goto LAB_00154016;
      uVar15 = *(ulong *)((long)base_ip + -3);
      uVar13 = (uVar15 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
      iVar3 = (int)base_ip;
      table[uVar15 * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -3;
      table[(uVar15 >> 8) * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -2;
      table[(uVar15 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = (iVar3 - iVar2) + -1;
      iVar4 = table[uVar13];
      table[uVar13] = iVar3 - iVar2;
      plStack_1be8 = (long *)base_ip;
    }
    uVar5 = (uint)((ulong)(*(long *)((long)plStack_1be8 + 1) * 0x1e35a7bd000000) >> 0x20);
    plVar9 = (long *)((long)plStack_1be8 + 1);
    base_ip = (uint8_t *)plStack_1be8;
  } while( true );
  local_1340 = local_1340 + 1;
  limit2 = limit2 + 8;
  goto LAB_0014fa91;
LAB_00152bae:
  local_1380 = local_1380 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00152b30;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}